

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

uint32_t icu_63::CollationDataBuilder::encodeOneCEAsCE32(int64_t ce)

{
  uint p_00;
  uint lower32_00;
  uint32_t t;
  uint32_t lower32;
  uint32_t p;
  int64_t ce_local;
  
  p_00 = (uint)((ulong)ce >> 0x20);
  lower32_00 = (uint)ce;
  if ((ce & 0xffff00ff00ffU) == 0) {
    ce_local._4_4_ = p_00 | lower32_00 >> 0x10 | (lower32_00 & 0xffff) >> 8;
  }
  else if ((ce & 0xffffffffffU) == 0x5000500) {
    ce_local._4_4_ = Collation::makeLongPrimaryCE32(p_00);
  }
  else if ((p_00 == 0) && ((ce & 0xffU) == 0)) {
    ce_local._4_4_ = Collation::makeLongSecondaryCE32(lower32_00);
  }
  else {
    ce_local._4_4_ = 1;
  }
  return ce_local._4_4_;
}

Assistant:

uint32_t
CollationDataBuilder::encodeOneCEAsCE32(int64_t ce) {
    uint32_t p = (uint32_t)(ce >> 32);
    uint32_t lower32 = (uint32_t)ce;
    uint32_t t = (uint32_t)(ce & 0xffff);
    U_ASSERT((t & 0xc000) != 0xc000);  // Impossible case bits 11 mark special CE32s.
    if((ce & INT64_C(0xffff00ff00ff)) == 0) {
        // normal form ppppsstt
        return p | (lower32 >> 16) | (t >> 8);
    } else if((ce & INT64_C(0xffffffffff)) == Collation::COMMON_SEC_AND_TER_CE) {
        // long-primary form ppppppC1
        return Collation::makeLongPrimaryCE32(p);
    } else if(p == 0 && (t & 0xff) == 0) {
        // long-secondary form ssssttC2
        return Collation::makeLongSecondaryCE32(lower32);
    }
    return Collation::NO_CE32;
}